

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

CPubKey * __thiscall CKey::GetPubKey(CPubKey *__return_storage_ptr__,CKey *this)

{
  byte bVar1;
  array<unsigned_char,_32UL> *seckey;
  int iVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  size_t clen;
  secp256k1_pubkey pubkey;
  size_t local_60;
  secp256k1_pubkey local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  seckey = (this->keydata)._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  if (seckey == (array<unsigned_char,_32UL> *)0x0) {
    __assert_fail("keydata",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0xb7,"CPubKey CKey::GetPubKey() const");
  }
  local_60 = 0x41;
  __return_storage_ptr__->vch[0] = 0xff;
  iVar2 = secp256k1_ec_pubkey_create(secp256k1_context_sign,&local_58,seckey->_M_elems);
  if (iVar2 != 0) {
    secp256k1_ec_pubkey_serialize
              (secp256k1_context_sign,__return_storage_ptr__->vch,&local_60,&local_58,
               (uint)this->fCompressed << 8 | 2);
    bVar1 = __return_storage_ptr__->vch[0];
    sVar3 = 0x21;
    if ((bVar1 & 0xfe) != 2) {
      if ((byte)(bVar1 - 4) < 4) {
        sVar3 = (&DAT_00e8a840)[(byte)(bVar1 - 4)];
      }
      else {
        sVar3 = 0;
      }
    }
    if (local_60 == sVar3) {
      if ((((bVar1 & 0xfe) != 2) && (1 < bVar1 - 6)) && (bVar1 != 4)) {
        __assert_fail("result.IsValid()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                      ,0xbf,"CPubKey CKey::GetPubKey() const");
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    __assert_fail("result.size() == clen",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0xbe,"CPubKey CKey::GetPubKey() const");
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp",
                0xbc,"CPubKey CKey::GetPubKey() const");
}

Assistant:

CPubKey CKey::GetPubKey() const {
    assert(keydata);
    secp256k1_pubkey pubkey;
    size_t clen = CPubKey::SIZE;
    CPubKey result;
    int ret = secp256k1_ec_pubkey_create(secp256k1_context_sign, &pubkey, UCharCast(begin()));
    assert(ret);
    secp256k1_ec_pubkey_serialize(secp256k1_context_sign, (unsigned char*)result.begin(), &clen, &pubkey, fCompressed ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED);
    assert(result.size() == clen);
    assert(result.IsValid());
    return result;
}